

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerUtil.cpp
# Opt level: O0

ByteString * DERUTIL::octet2Raw(ByteString *byteString)

{
  bool bVar1;
  size_t sVar2;
  uchar *puVar3;
  byte *pbVar4;
  ByteString *pBVar5;
  ByteString *this;
  ByteString *this_00;
  ByteString *pBVar6;
  unsigned_long uVar7;
  ByteString *in_RDI;
  ByteString length;
  size_t lengthOctets;
  size_t controlOctets;
  size_t len;
  ByteString repr;
  ByteString rv;
  size_t in_stack_fffffffffffffed8;
  ByteString *in_stack_fffffffffffffee0;
  ByteString *in_stack_fffffffffffffee8;
  ByteString *in_stack_fffffffffffffef0;
  byte *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  ByteString *in_stack_ffffffffffffff18;
  
  ByteString::ByteString((ByteString *)0x1a4971);
  ByteString::ByteString(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  sVar2 = ByteString::size((ByteString *)0x1a4995);
  if (sVar2 < 2) {
    softHSMLog(3,"octet2Raw",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
               ,0x54,"Undersized octet string");
    ByteString::ByteString(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    puVar3 = ByteString::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (*puVar3 == '\x04') {
      pbVar4 = ByteString::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      if (*pbVar4 < 0x80) {
        in_stack_ffffffffffffff18 =
             (ByteString *)
             ByteString::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if ((ulong)*(byte *)&in_stack_ffffffffffffff18->_vptr_ByteString != sVar2 - 2) {
          pbVar4 = ByteString::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          if ((ulong)*pbVar4 < sVar2 - 2) {
            softHSMLog(3,"octet2Raw",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                       ,0x67,"Underrun octet string");
          }
          else {
            softHSMLog(3,"octet2Raw",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                       ,0x6b,"Overrun octet string");
          }
          ByteString::ByteString(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          goto LAB_001a4e0c;
        }
      }
      else {
        in_stack_ffffffffffffff08 =
             ByteString::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        pBVar5 = (ByteString *)((ulong)(*in_stack_ffffffffffffff08 & 0x7f) + 2);
        pBVar6 = pBVar5;
        this = (ByteString *)ByteString::size((ByteString *)0x1a4c30);
        if (this <= pBVar6) {
          softHSMLog(3,"octet2Raw",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                     ,0x79,"Undersized octet string");
          ByteString::ByteString(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          goto LAB_001a4e0c;
        }
        this_00 = (ByteString *)
                  ByteString::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        ByteString::ByteString(this,(uchar *)pBVar6,(size_t)this_00);
        pBVar6 = (ByteString *)ByteString::long_val(this);
        if (pBVar6 == (ByteString *)(sVar2 - (long)pBVar5)) {
          bVar1 = false;
        }
        else {
          uVar7 = ByteString::long_val(this);
          if (uVar7 < sVar2 - (long)pBVar5) {
            softHSMLog(3,"octet2Raw",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                       ,0x84,"Underrun octet string");
          }
          else {
            softHSMLog(3,"octet2Raw",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                       ,0x88,"Overrun octet string");
          }
          ByteString::ByteString(this_00,pBVar6);
          bVar1 = true;
        }
        ByteString::~ByteString((ByteString *)0x1a4dcb);
        if (bVar1) goto LAB_001a4e0c;
      }
      ByteString::substr(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         (size_t)in_stack_ffffffffffffff08);
    }
    else {
      softHSMLog(3,"octet2Raw",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/DerUtil.cpp"
                 ,0x5b,"ByteString is not an octet string");
      ByteString::ByteString(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
LAB_001a4e0c:
  ByteString::~ByteString((ByteString *)0x1a4e19);
  ByteString::~ByteString((ByteString *)0x1a4e26);
  return in_RDI;
}

Assistant:

ByteString DERUTIL::octet2Raw(const ByteString& byteString)
{
	ByteString rv;
	ByteString repr = byteString;
	size_t len = repr.size();
	size_t controlOctets = 2;

	if (len < controlOctets)
	{
		ERROR_MSG("Undersized octet string");

		return rv;
	}

	if (repr[0] != 0x04)
	{
		ERROR_MSG("ByteString is not an octet string");

		return rv;
	}

	// Definite, short
	if (repr[1] < 0x80)
	{
		if (repr[1] != (len - controlOctets))
		{
			if (repr[1] < (len - controlOctets))
			{
				ERROR_MSG("Underrun octet string");
			}
			else
			{
				ERROR_MSG("Overrun octet string");
			}

			return rv;
		}
	}
	// Definite, long
	else
	{
		size_t lengthOctets = repr[1] & 0x7f;
		controlOctets += lengthOctets;

		if (controlOctets >= repr.size())
		{
			ERROR_MSG("Undersized octet string");

			return rv;
		}

		ByteString length(&repr[2], lengthOctets);

		if (length.long_val() != (len - controlOctets))
                {
			if (length.long_val() < (len - controlOctets))
			{
				ERROR_MSG("Underrun octet string");
			}
			else
			{
				ERROR_MSG("Overrun octet string");
			}

			return rv;
		}
	}

	return repr.substr(controlOctets, len - controlOctets);
}